

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDP_Solver.cpp
# Opt level: O2

double runOneSimulation(QTable *q,PlanningUnitDecPOMDPDiscrete *np,SimulationDecPOMDPDiscrete *sim)

{
  ulong uVar1;
  AgentMDP *this;
  ulong uVar2;
  uint uVar3;
  AgentFullyObservable *newAgent;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  SimulationResult result;
  AgentMDP agent;
  
  uVar2 = 0;
  AgentMDP::AgentMDP(&agent,np,0,q);
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)np + 0x30))(np);
    if (uVar1 <= uVar2) break;
    this = (AgentMDP *)operator_new(0x58);
    AgentMDP::AgentMDP(this,&agent);
    newAgent = (AgentFullyObservable *)this;
    (**(code **)(*(long *)(this + *(long *)(*(long *)this + -0x18)) + 0x18))
              (this + *(long *)(*(long *)this + -0x18),uVar2);
    std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::push_back
              (&agents,&newAgent);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            ((SimulationDecPOMDPDiscrete *)&result,
             (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)sim);
  uVar3 = 0;
  while( true ) {
    uVar2 = (**(code **)(*(long *)np + 0x30))(np);
    if (uVar2 <= uVar3) break;
    if (agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3] != (AgentFullyObservable *)0x0) {
      (**(code **)(*(long *)agents.
                            super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3] + 8))();
    }
    uVar3 = uVar3 + 1;
  }
  SimulationResult::~SimulationResult(&result);
  std::_Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::~_Vector_base
            (&agents.
              super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>);
  AgentMDP::~AgentMDP(&agent);
  return _result;
}

Assistant:

double runOneSimulation(  const QTable & q,
                          const PlanningUnitDecPOMDPDiscrete *np,
                          const SimulationDecPOMDPDiscrete &sim
                          )
{
    AgentMDP agent(np, 0, q);
    AgentFullyObservable *newAgent;
    vector<AgentFullyObservable*> agents;

    for(Index i=0; i < np->GetNrAgents(); i++)
    {
        newAgent=new AgentMDP(agent);
        newAgent->SetIndex(i);
        agents.push_back(newAgent);
    }
    SimulationResult result=sim.RunSimulations(agents);
    double avgReward=result.GetAvgReward();

    for(Index i=0; i < np->GetNrAgents(); i++)
        delete agents[i];

    return(avgReward);
}